

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase * CreateConditionCast(ExpressionContext *ctx,SynBase *source,ExprBase *value)

{
  TypeStruct *pTVar1;
  SynBase *pSVar2;
  TypeBase *pTVar3;
  int iVar4;
  undefined4 extraout_var;
  ExprBase *pEVar5;
  ExprError *pEVar6;
  undefined4 extraout_var_00;
  TypeStruct *type;
  InplaceStr name;
  
  pTVar1 = (TypeStruct *)value->type;
  if ((pTVar1 == (TypeStruct *)0x0) || ((pTVar1->super_TypeBase).typeID != 0)) {
    type = (TypeStruct *)ctx->typeBool;
    if ((type == pTVar1) ||
       (((((TypeStruct *)ctx->typeChar == pTVar1 || ((TypeStruct *)ctx->typeShort == pTVar1)) ||
         ((TypeStruct *)ctx->typeInt == pTVar1)) ||
        (((TypeStruct *)ctx->typeLong == pTVar1 || ((pTVar1->super_TypeBase).isGeneric != false)))))
       ) {
      AssertValueExpression(ctx,source,value);
      pEVar5 = value;
      if (value->type == ctx->typeLong) {
        type = (TypeStruct *)ctx->typeBool;
        goto LAB_00151e04;
      }
    }
    else {
      if ((((TypeStruct *)ctx->typeFloat == pTVar1) || ((TypeStruct *)ctx->typeDouble == pTVar1)) ||
         ((pTVar1 != (TypeStruct *)0x0 &&
          (((pTVar1->super_TypeBase).typeID == 0x12 ||
           ((pTVar1 != (TypeStruct *)0x0 &&
            (((pTVar1->super_TypeBase).typeID == 0x14 ||
             ((pTVar1 != (TypeStruct *)0x0 && ((pTVar1->super_TypeBase).typeID == 0x15)))))))))))) {
LAB_00151e04:
        pEVar5 = CreateCast(ctx,source,value,&type->super_TypeBase,false);
        return pEVar5;
      }
      if (pTVar1 == ctx->typeAutoRef) {
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
        pEVar5 = (ExprBase *)CONCAT44(extraout_var_00,iVar4);
        pSVar2 = value->source;
        pTVar3 = ctx->typeNullPtr;
        pEVar5->typeID = 9;
        pEVar5->source = pSVar2;
        pEVar5->type = pTVar3;
        pEVar5->next = (ExprBase *)0x0;
        pEVar5->listed = false;
        pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002295f0;
        pEVar5 = CreateBinaryOp(ctx,source,SYN_BINARY_OP_NOT_EQUAL,value,pEVar5);
        return pEVar5;
      }
      name.end = "";
      name.begin = "bool";
      pEVar5 = CreateFunctionCall1(ctx,source,name,value,true,false,false);
      if (pEVar5 == (ExprBase *)0x0) {
        pEVar6 = anon_unknown.dwarf_9fd58::ReportExpected
                           (ctx,source,ctx->typeBool,
                            "ERROR: condition type cannot be \'%.*s\' and function for conversion to bool is undefined"
                            ,(ulong)(uint)(*(int *)&(value->type->name).end -
                                          (int)(value->type->name).begin));
        return &pEVar6->super_ExprBase;
      }
    }
  }
  else {
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar5 = (ExprBase *)CONCAT44(extraout_var,iVar4);
    pTVar3 = ctx->typeBool;
    pEVar5->typeID = 0x12;
    pEVar5->source = source;
    pEVar5->type = pTVar3;
    pEVar5->next = (ExprBase *)0x0;
    pEVar5->listed = false;
    pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002299e8;
    pEVar5[1]._vptr_ExprBase = (_func_int **)value;
    pEVar5[1].typeID = 0xd;
  }
  return pEVar5;
}

Assistant:

ExprBase* CreateConditionCast(ExpressionContext &ctx, SynBase *source, ExprBase *value)
{
	if(isType<TypeError>(value->type))
		return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, ctx.typeBool, value, EXPR_CAST_REINTERPRET);

	if(!ctx.IsIntegerType(value->type) && !value->type->isGeneric)
	{
		// TODO: function overload

		if(ctx.IsFloatingPointType(value->type))
			return CreateCast(ctx, source, value, ctx.typeBool, false);

		if(isType<TypeRef>(value->type))
			return CreateCast(ctx, source, value, ctx.typeBool, false);

		if(isType<TypeUnsizedArray>(value->type))
			return CreateCast(ctx, source, value, ctx.typeBool, false);

		if(isType<TypeFunction>(value->type))
			return CreateCast(ctx, source, value, ctx.typeBool, false);

		if(value->type == ctx.typeAutoRef)
		{
			ExprBase *nullPtr = new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(value->source, ctx.typeNullPtr);

			return CreateBinaryOp(ctx, source, SYN_BINARY_OP_NOT_EQUAL, value, nullPtr);
		}
		else
		{
			if(ExprBase *call = CreateFunctionCall1(ctx, source, InplaceStr("bool"), value, true, false, false))
				return call;

			return ReportExpected(ctx, source, ctx.typeBool, "ERROR: condition type cannot be '%.*s' and function for conversion to bool is undefined", FMT_ISTR(value->type->name));
		}
	}

	AssertValueExpression(ctx, source, value);

	if(value->type == ctx.typeLong)
		value = CreateCast(ctx, source, value, ctx.typeBool, false);

	return value;
}